

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O2

void __thiscall
NshCmdArrayFindMatching_FailurePopulated_Test::TestBody
          (NshCmdArrayFindMatching_FailurePopulated_Test *this)

{
  nsh_status_t nVar1;
  pointer *__ptr;
  char *pcVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_338;
  nsh_cmd_t *cmd;
  AssertionResult gtest_ar;
  AssertHelper local_318;
  nsh_cmd_array_t cmds;
  
  nVar1 = nsh_cmd_array_init(&cmds);
  cmd = (nsh_cmd_t *)CONCAT44(cmd._4_4_,nVar1);
  local_338._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_338._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)&gtest_ar,"nsh_cmd_array_init(&cmds)","NSH_STATUS_OK",(nsh_status *)&cmd,
             (nsh_status *)&local_338);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&cmd);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&cmd);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    nVar1 = nsh_cmd_array_register(&cmds,"cmd1_test",cmd_test_handler);
    cmd = (nsh_cmd_t *)CONCAT44(cmd._4_4_,nVar1);
    local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              ((internal *)&gtest_ar,
               "nsh_cmd_array_register(&cmds, \"cmd1_test\", &cmd_test_handler)","NSH_STATUS_OK",
               (nsh_status *)&cmd,(nsh_status *)&local_338);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&cmd);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_338,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&cmd);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      nVar1 = nsh_cmd_array_register(&cmds,"cmd2_test",cmd_test_handler);
      cmd = (nsh_cmd_t *)CONCAT44(cmd._4_4_,nVar1);
      local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                ((internal *)&gtest_ar,
                 "nsh_cmd_array_register(&cmds, \"cmd2_test\", &cmd_test_handler)","NSH_STATUS_OK",
                 (nsh_status *)&cmd,(nsh_status *)&local_338);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&cmd);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_338,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,100,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&cmd);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        nVar1 = nsh_cmd_array_register(&cmds,"cmd3_test",cmd_test_handler);
        cmd = (nsh_cmd_t *)CONCAT44(cmd._4_4_,nVar1);
        local_338._M_head_impl = local_338._M_head_impl & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                  ((internal *)&gtest_ar,
                   "nsh_cmd_array_register(&cmds, \"cmd3_test\", &cmd_test_handler)","NSH_STATUS_OK"
                   ,(nsh_status *)&cmd,(nsh_status *)&local_338);
        if (gtest_ar.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          cmd = nsh_cmd_array_find_matching(&cmds,"cmd2_",6);
          local_338._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperEQ<nsh_cmd_const*,decltype(nullptr)>
                    ((internal *)&gtest_ar,"cmd","nullptr",&cmd,&local_338._M_head_impl);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_338);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_318,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                       ,0x6a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_338);
            testing::internal::AssertHelper::~AssertHelper(&local_318);
            if (local_338._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_338._M_head_impl + 8))();
            }
          }
          goto LAB_001152dc;
        }
        testing::Message::Message((Message *)&cmd);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_338,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x65,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&cmd);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (cmd != (nsh_cmd_t *)0x0) {
    (**(code **)(cmd->handler + 8))();
  }
LAB_001152dc:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(NshCmdArrayFindMatching, FailurePopulated)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd1_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd2_test", &cmd_test_handler), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd3_test", &cmd_test_handler), NSH_STATUS_OK);

    static constexpr const char searched_for[] = "cmd2_";
    auto* cmd = nsh_cmd_array_find_matching(&cmds, searched_for, sizeof(searched_for));

    ASSERT_EQ(cmd, nullptr);
}